

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelf<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)(this->total_size_ << 3);
  if (this->elements_ == (void **)0x0) {
    uVar2 = uVar3;
  }
  for (; (long)uVar3 < (long)this->allocated_size_; uVar3 = uVar3 + 1) {
    iVar1 = StringTypeHandler::SpaceUsed((string *)this->elements_[uVar3]);
    uVar2 = (ulong)(uint)((int)uVar2 + iVar1);
  }
  return (int)uVar2;
}

Assistant:

inline int RepeatedPtrFieldBase::SpaceUsedExcludingSelf() const {
  int allocated_bytes =
      (elements_ != NULL) ? total_size_ * sizeof(elements_[0]) : 0;
  for (int i = 0; i < allocated_size_; ++i) {
    allocated_bytes += TypeHandler::SpaceUsed(*cast<TypeHandler>(elements_[i]));
  }
  return allocated_bytes;
}